

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void key_count_suite::count_map(void)

{
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_6f8;
  undefined4 local_6ec;
  basic_variable<std::allocator<char>_> local_6e8;
  size_type local_6b8;
  undefined4 local_6ac;
  size_type local_6a8;
  undefined4 local_69c;
  basic_variable<std::allocator<char>_> local_698;
  size_type local_668;
  undefined4 local_65c;
  size_type local_658;
  undefined4 local_64c;
  basic_variable<std::allocator<char>_> local_648;
  size_type local_618;
  undefined4 local_60c;
  size_type local_608;
  undefined4 local_5fc;
  basic_variable<std::allocator<char>_> local_5f8;
  size_type local_5c8;
  undefined4 local_5bc;
  size_type local_5b8;
  undefined4 local_5ac;
  basic_variable<std::allocator<char>_> local_5a8;
  size_type local_570;
  undefined4 local_564;
  double local_560;
  size_type local_558;
  undefined4 local_54c;
  basic_variable<std::allocator<char>_> local_548;
  size_type local_510 [2];
  undefined4 local_500;
  int local_4fc;
  size_type local_4f8;
  undefined4 local_4ec;
  basic_variable<std::allocator<char>_> local_4e8;
  size_type local_4b0 [2];
  undefined4 local_4a0;
  bool local_499;
  size_type local_498;
  undefined4 local_48c;
  basic_variable<std::allocator<char>_> local_488;
  size_type local_450 [2];
  undefined4 local_440;
  nullable local_43c;
  size_type local_438;
  undefined4 local_42c;
  size_type local_428;
  undefined4 local_41c;
  size_type local_418;
  undefined4 local_40c;
  size_type local_408;
  undefined4 local_3fc;
  size_type local_3f8;
  undefined4 local_3ec;
  size_type local_3e8;
  undefined4 local_3dc;
  size_type local_3d8;
  undefined4 local_3cc;
  basic_variable<std::allocator<char>_> local_3c8;
  size_type local_398;
  undefined4 local_38c;
  size_type local_388 [2];
  double local_378;
  int local_36c;
  bool local_365 [17];
  nullable local_354;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_350;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_348;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_288;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  local_350 = &local_348;
  local_354 = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::nullable,_true>
            (local_350,(char (*) [6])"alpha",&local_354);
  local_350 = &local_2e8;
  local_365[0] = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_350,(char (*) [6])"bravo",local_365);
  local_350 = &local_288;
  local_36c = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_int,_true>(local_350,(char (*) [8])"charlie",&local_36c);
  local_350 = &local_228;
  local_378 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_double,_true>(local_350,(char (*) [6])"delta",&local_378);
  local_350 = &local_1c8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
            (local_350,(char (*) [5])"echo",(char (*) [9])"hydrogen");
  local_350 = &local_168;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_wchar_t_(&)[7],_true>
            (local_350,(char (*) [8])"foxtrot",(wchar_t (*) [7])L"helium");
  local_350 = &local_108;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char16_t_(&)[8],_true>
            (local_350,(char (*) [5])"golf",(char16_t (*) [8])L"lithium");
  local_350 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char32_t_(&)[10],_true>
            (local_350,(char (*) [6])"hotel",(char32_t (*) [10])L"beryllium");
  local_48._0_8_ = &local_348;
  local_48._8_8_ = 8;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x8;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_6f8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_6f8 = local_6f8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_6f8);
  } while (local_6f8 != &local_348);
  local_388[0] = trial::dynamic::key::count<std::allocator<char>,char[6]>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                            (char (*) [6])"alpha");
  local_38c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"alpha\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x25,"void key_count_suite::count_map()",local_388,&local_38c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,"alpha");
  local_398 = trial::dynamic::key::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_3c8);
  local_3cc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(\"alpha\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x26,"void key_count_suite::count_map()",&local_398,&local_3cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  local_3d8 = trial::dynamic::key::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [6])"bravo");
  local_3dc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"bravo\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x27,"void key_count_suite::count_map()",&local_3d8,&local_3dc);
  local_3e8 = trial::dynamic::key::count<std::allocator<char>,char[8]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [8])"charlie");
  local_3ec = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"charlie\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x28,"void key_count_suite::count_map()",&local_3e8,&local_3ec);
  local_3f8 = trial::dynamic::key::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [6])"delta");
  local_3fc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"delta\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x29,"void key_count_suite::count_map()",&local_3f8,&local_3fc);
  local_408 = trial::dynamic::key::count<std::allocator<char>,char[5]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [5])"echo");
  local_40c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"echo\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x2a,"void key_count_suite::count_map()",&local_408,&local_40c);
  local_418 = trial::dynamic::key::count<std::allocator<char>,char[8]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [8])"foxtrot");
  local_41c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"foxtrot\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x2b,"void key_count_suite::count_map()",&local_418,&local_41c);
  local_428 = trial::dynamic::key::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [6])"hotel");
  local_42c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"hotel\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x2c,"void key_count_suite::count_map()",&local_428,&local_42c);
  local_43c = null;
  local_438 = trial::dynamic::key::count<std::allocator<char>,trial::dynamic::nullable>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_43c);
  local_440 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x2d,"void key_count_suite::count_map()",&local_438,&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_488);
  local_450[0] = trial::dynamic::key::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_488);
  local_48c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x2e,"void key_count_suite::count_map()",local_450,&local_48c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_488);
  local_499 = true;
  local_498 = trial::dynamic::key::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_499);
  local_4a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x2f,"void key_count_suite::count_map()",&local_498,&local_4a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4e8,true);
  local_4b0[0] = trial::dynamic::key::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_4e8);
  local_4ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x30,"void key_count_suite::count_map()",local_4b0,&local_4ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  local_4fc = 2;
  local_4f8 = trial::dynamic::key::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_4fc);
  local_500 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x31,"void key_count_suite::count_map()",&local_4f8,&local_500);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_548,2);
  local_510[0] = trial::dynamic::key::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_548);
  local_54c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x32,"void key_count_suite::count_map()",local_510,&local_54c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  local_560 = 3.0;
  local_558 = trial::dynamic::key::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_560);
  local_564 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x33,"void key_count_suite::count_map()",&local_558,&local_564);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5a8,3.0);
  local_570 = trial::dynamic::key::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_5a8);
  local_5ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x34,"void key_count_suite::count_map()",&local_570,&local_5ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5a8);
  local_5b8 = trial::dynamic::key::count<std::allocator<char>,char[9]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [9])"hydrogen");
  local_5bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, \"hydrogen\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x35,"void key_count_suite::count_map()",&local_5b8,&local_5bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5f8,"hydrogen");
  local_5c8 = trial::dynamic::key::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_5f8);
  local_5fc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(\"hydrogen\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x36,"void key_count_suite::count_map()",&local_5c8,&local_5fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5f8);
  local_608 = trial::dynamic::key::count<std::allocator<char>,wchar_t[7]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (wchar_t (*) [7])L"helium");
  local_60c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, L\"helium\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x37,"void key_count_suite::count_map()",&local_608,&local_60c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_648,L"helium");
  local_618 = trial::dynamic::key::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_648);
  local_64c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(L\"helium\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x38,"void key_count_suite::count_map()",&local_618,&local_64c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  local_658 = trial::dynamic::key::count<std::allocator<char>,char16_t[8]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char16_t (*) [8])L"lithium");
  local_65c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, u\"lithium\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x39,"void key_count_suite::count_map()",&local_658,&local_65c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_698,L"lithium");
  local_668 = trial::dynamic::key::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_698);
  local_69c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(u\"lithium\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x3a,"void key_count_suite::count_map()",&local_668,&local_69c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  local_6a8 = trial::dynamic::key::count<std::allocator<char>,char32_t[10]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char32_t (*) [10])L"beryllium");
  local_6ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, U\"beryllium\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x3b,"void key_count_suite::count_map()",&local_6a8,&local_6ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6e8,L"beryllium");
  local_6b8 = trial::dynamic::key::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_6e8);
  local_6ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("key::count(data, variable(U\"beryllium\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x3c,"void key_count_suite::count_map()",&local_6b8,&local_6ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void count_map()
{
    variable data = map::make(
        {
            {"alpha", null},
            {"bravo", true},
            {"charlie", 2},
            {"delta", 3.0},
            {"echo", "hydrogen"},
            {"foxtrot", L"helium"},
            {"golf", u"lithium"},
            {"hotel", U"beryllium"}
        });

    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "alpha"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable("alpha")), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "bravo"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "charlie"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "delta"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "echo"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "foxtrot"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "hotel"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, null), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, true), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable(true)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, 2), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable(2)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, 3.0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable(3.0)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, "hydrogen"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable("hydrogen")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, L"helium"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable(L"helium")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, u"lithium"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable(u"lithium")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, U"beryllium"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(key::count(data, variable(U"beryllium")), 0);
}